

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

void __thiscall flexbuffers::Builder::Write<double>(Builder *this,double val,size_t byte_width)

{
  double local_8;
  
  if (byte_width < 9) {
    local_8 = val;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_8,(long)&local_8 + byte_width);
    return;
  }
  __assert_fail("sizeof(T) >= byte_width",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x5a3,"void flexbuffers::Builder::Write(T, size_t) [T = double]");
}

Assistant:

void Write(T val, size_t byte_width) {
    FLATBUFFERS_ASSERT(sizeof(T) >= byte_width);
    val = flatbuffers::EndianScalar(val);
    WriteBytes(&val, byte_width);
  }